

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O1

IdleDecommitSignal __thiscall
Memory::IdleDecommitPageAllocator::LeaveIdleDecommit
          (IdleDecommitPageAllocator *this,bool allowTimer)

{
  uint *puVar1;
  CriticalSection *this_00;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  DWORD DVar5;
  DWORD DVar6;
  undefined4 *puVar7;
  ThreadContextId pvVar8;
  ulong uVar9;
  AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag;
  char16_t *form;
  IdleDecommitSignal IVar10;
  
  if ((this->super_PageAllocator).idleDecommitEnterCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,0x62,"(this->idleDecommitEnterCount > 0)","this->idleDecommitEnterCount > 0"
                      );
    if (!bVar4) goto LAB_006ef9e9;
    *puVar7 = 0;
  }
  if ((this->super_PageAllocator).maxFreePageCount != this->maxIdleDecommitFreePageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,99,"(this->maxFreePageCount == maxIdleDecommitFreePageCount)",
                       "this->maxFreePageCount == maxIdleDecommitFreePageCount");
    if (!bVar4) goto LAB_006ef9e9;
    *puVar7 = 0;
  }
  if (this->hasDecommitTimer == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,0x6b,"(!hasDecommitTimer)","!hasDecommitTimer");
    if (!bVar4) goto LAB_006ef9e9;
    *puVar7 = 0;
  }
  puVar1 = &(this->super_PageAllocator).idleDecommitEnterCount;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return IdleDecommitSignal_None;
  }
  if (!allowTimer) {
    (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::DecommitNow(&this->super_PageAllocator,true);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ClearMinFreePageCount(&this->super_PageAllocator);
    return IdleDecommitSignal_None;
  }
  this_00 = &this->cs;
  bVar4 = CCLock::TryEnter(&this_00->super_CCLock);
  if (!bVar4) {
    (this->super_PageAllocator).waitingToEnterIdleDecommit = true;
    CCLock::Enter(&this_00->super_CCLock);
    (this->super_PageAllocator).waitingToEnterIdleDecommit = false;
  }
  bVar4 = Js::Phases::IsEnabled
                    (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,PageAllocatorPhase
                    );
  if ((bVar4) && (((this->super_PageAllocator).pageAllocatorFlagTable)->Verbose == true)) {
    pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar5 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar5,this);
    if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"LeaveIdleDecommit");
    Output::Print(L"\n");
    Output::Flush();
  }
  if (this->maxIdleDecommitFreePageCount == this->maxNonIdleDecommitFreePageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                       ,0x8c,"(maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount)",
                       "maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount");
    if (!bVar4) goto LAB_006ef9e9;
    *puVar7 = 0;
  }
  if ((((this->super_PageAllocator).freePageCount == 0) &&
      ((this->super_PageAllocator).isUsed == false)) && (this->hadDecommitTimer == false)) {
    if ((this->super_PageAllocator).minFreePageCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                         ,0x91,"(minFreePageCount == 0)","minFreePageCount == 0");
      if (!bVar4) goto LAB_006ef9e9;
      *puVar7 = 0;
    }
    if ((this->super_PageAllocator).minFreePageCount !=
        (this->super_PageAllocator).debugMinFreePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/IdleDecommitPageAllocator.cpp"
                         ,0x92,"(minFreePageCount == debugMinFreePageCount)",
                         "minFreePageCount == debugMinFreePageCount");
      if (!bVar4) {
LAB_006ef9e9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    (this->super_PageAllocator).maxFreePageCount = this->maxNonIdleDecommitFreePageCount;
    IVar10 = IdleDecommitSignal_None;
  }
  else {
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::UpdateMinFreePageCount(&this->super_PageAllocator);
    this->hasDecommitTimer = true;
    if ((this->super_PageAllocator).isUsed == true) {
      DVar5 = GetTickCount();
      this->decommitTime = DVar5 + 1000;
      bVar4 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      IVar10 = IdleDecommitSignal_NeedTimer;
      if (!bVar4) goto LAB_006ef905;
      pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar5,this);
      if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      uVar2 = this->decommitTime;
      form = L"Schedule idle decommit at %d (%d)";
      uVar9 = 1000;
    }
    else {
      DVar5 = this->decommitTime;
      DVar6 = GetTickCount();
      IVar10 = ((int)(DVar5 - DVar6) < 0x14) + IdleDecommitSignal_NeedTimer;
      bVar4 = Js::Phases::IsEnabled
                        (&((this->super_PageAllocator).pageAllocatorFlagTable)->Trace,
                         PageAllocatorPhase);
      if (!bVar4) goto LAB_006ef905;
      pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar5,this);
      if ((this->super_PageAllocator).debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      uVar2 = this->decommitTime;
      DVar5 = GetTickCount();
      uVar9 = (ulong)(uVar2 - DVar5);
      form = L"Reschedule idle decommit at %d (%d)";
    }
    Output::Print(form,(ulong)uVar2,uVar9);
    Output::Print(L"\n");
    Output::Flush();
  }
LAB_006ef905:
  CCLock::Leave(&this_00->super_CCLock);
  return IVar10;
}

Assistant:

IdleDecommitSignal
IdleDecommitPageAllocator::LeaveIdleDecommit(bool allowTimer)
{
    Assert(this->idleDecommitEnterCount > 0);
    Assert(this->maxFreePageCount == maxIdleDecommitFreePageCount);

#ifdef ENABLE_BASIC_TELEMETRY
    AllocatorDecommitStats * decommitStats = this->GetDecommitStats();
    decommitStats->lastLeaveDecommitRegion = Js::Tick::Now();
#endif

#ifdef IDLE_DECOMMIT_ENABLED
    Assert(!hasDecommitTimer);
#endif

    this->idleDecommitEnterCount--;
    if (this->idleDecommitEnterCount != 0)
    {
        return IdleDecommitSignal_None;
    }

#ifdef IDLE_DECOMMIT_ENABLED
    if (allowTimer)
    {
        if (!cs.TryEnter())
        {
            AutoResetWaitingToEnterIdleDecommitFlag autoResetWaitingToEnterIdleDecommitFlag(this);

#ifdef ENABLE_BASIC_TELEMETRY
            decommitStats->lastEnterLeaveIdleDecommitTick = Js::Tick::Now();
#endif

            cs.Enter();

#ifdef ENABLE_BASIC_TELEMETRY
            decommitStats->lastEnterLeaveIdleDecommitCSWaitTime = Js::Tick::Now() - decommitStats->lastEnterLeaveIdleDecommitTick;
            decommitStats->totalEnterLeaveIdleDecommitCSWaitTime += decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
            if (decommitStats->lastEnterLeaveIdleDecommitCSWaitTime > decommitStats->maxEnterLeaveIdleDecommitCSWaitTime)
            {
                decommitStats->maxEnterLeaveIdleDecommitCSWaitTime = decommitStats->lastEnterLeaveIdleDecommitCSWaitTime;
            }
#endif
        }

        PAGE_ALLOC_VERBOSE_TRACE(_u("LeaveIdleDecommit"));
        Assert(maxIdleDecommitFreePageCount != maxNonIdleDecommitFreePageCount);

        IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
        if (freePageCount == 0 && !isUsed && !hadDecommitTimer)
        {
            Assert(minFreePageCount == 0);
            Assert(minFreePageCount == debugMinFreePageCount);

            // Nothing to decommit, it isn't used, and there was no timer before.
            // Just switch it back to non idle decommit mode
            this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
        }
        else
        {
            UpdateMinFreePageCount();

            hasDecommitTimer = true;
            idleDecommitSignal = IdleDecommitSignal_NeedTimer;

            if (isUsed)
            {
                // Reschedule the timer
                decommitTime = ::GetTickCount() + IdleDecommitTimeout;
                PAGE_ALLOC_TRACE( _u("Schedule idle decommit at %d (%d)"), decommitTime, IdleDecommitTimeout);
            }
            else
            {
                int timeDiff = (int)decommitTime - ::GetTickCount();
                if (timeDiff < 20)
                {
                    idleDecommitSignal = IdleDecommitSignal_NeedSignal;
                }

                PAGE_ALLOC_TRACE(_u("Reschedule idle decommit at %d (%d)"), decommitTime, decommitTime - ::GetTickCount());
            }

        }
        cs.Leave();
        return idleDecommitSignal;
    }
#endif
    this->maxFreePageCount = maxNonIdleDecommitFreePageCount;
    __super::DecommitNow();
    ClearMinFreePageCount();
    return IdleDecommitSignal_None;
}